

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Extractor::~Extractor(Extractor *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Extractor_01fa1898;
  clear((Extractor *)0x197452);
  pvVar1 = (void *)in_RDI[1];
  if (pvVar1 != (void *)0x0) {
    ExtractorPrivate::~ExtractorPrivate((ExtractorPrivate *)0x197470);
    operator_delete(pvVar1,0x60);
  }
  return;
}

Assistant:

Extractor::~Extractor()
{
    clear();

    delete d;
}